

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Minisat::Solver::addClause_(Solver *this,vec<Minisat::Lit,_int> *ps)

{
  Lit p;
  uint uVar1;
  lbool lVar2;
  bool bVar3;
  uint uVar4;
  CRef CVar5;
  undefined8 in_RAX;
  long lVar6;
  long lVar7;
  uint uVar8;
  undefined2 uStack_38;
  undefined5 local_35;
  CRef cr;
  
  if ((this->trail_lim).sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x9c,"bool Minisat::Solver::addClause_(vec<Lit> &)");
  }
  uVar8 = 0;
  if (this->ok == true) {
    _uStack_38 = in_RAX;
    sort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>(ps);
    uVar4 = 0xfffffffe;
    for (lVar7 = 0; lVar7 < ps->sz; lVar7 = lVar7 + 1) {
      lVar2 = value(this,(Lit)ps->data[lVar7].x);
      _uStack_38 = CONCAT13(lVar2.value,_uStack_38);
      bVar3 = lbool::operator==((lbool *)&stack0xffffffffffffffcb,l_True);
      if ((bVar3) || (p.x = ps->data[lVar7].x, (p.x ^ uVar4) == 1)) goto LAB_00108467;
      lVar2 = value(this,p);
      _uStack_38 = CONCAT12(lVar2.value,uStack_38);
      bVar3 = lbool::operator!=((lbool *)&stack0xffffffffffffffca,l_False);
      if (bVar3) {
        uVar1 = ps->data[lVar7].x;
        if (uVar1 != uVar4) {
          lVar6 = (long)(int)uVar8;
          uVar8 = uVar8 + 1;
          ps->data[lVar6].x = uVar1;
          uVar4 = uVar1;
        }
      }
    }
    vec<Minisat::Lit,_int>::shrink(ps,(int)lVar7 - uVar8);
    if (ps->sz == 1) {
      uncheckedEnqueue(this,(Lit)ps->data->x,0xffffffff);
      CVar5 = propagate(this);
      uVar8 = (uint)(CVar5 == 0xffffffff);
      this->ok = CVar5 == 0xffffffff;
    }
    else if (ps->sz == 0) {
      this->ok = false;
      uVar8 = 0;
    }
    else {
      CVar5 = ClauseAllocator::alloc(&this->ca,ps,false);
      cr = CVar5;
      vec<unsigned_int,_int>::push(&this->clauses,&cr);
      attachClause(this,cr);
LAB_00108467:
      uVar8 = 1;
    }
  }
  return SUB41(uVar8,0);
}

Assistant:

bool Solver::addClause_(vec<Lit>& ps)
{
    assert(decisionLevel() == 0);
    if (!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);
    Lit p; int i, j;
    for (i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if (value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if (value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if (ps.size() == 0)
        return ok = false;
    else if (ps.size() == 1){
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    }else{
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}